

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# student.h
# Opt level: O0

void __thiscall CP::vector<int>::uniq(vector<int> *this)

{
  bool bVar1;
  _Node_iterator_base<int,_false> local_80;
  _Node_iterator_base<int,_false> local_78;
  int local_70;
  int i;
  undefined1 local_60 [8];
  vector<int> tmp;
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> s;
  vector<int> *this_local;
  
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &tmp.mSize);
  vector((vector<int> *)local_60);
  for (local_70 = 0; (ulong)(long)local_70 < this->mSize; local_70 = local_70 + 1) {
    local_78._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::find
                   ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    &tmp.mSize,this->mData + local_70);
    local_80._M_cur =
         (__node_type *)
         std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::end
                   ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                    &tmp.mSize);
    bVar1 = std::__detail::operator==(&local_78,&local_80);
    if (bVar1) {
      std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                 &tmp.mSize,this->mData + local_70);
      push_back((vector<int> *)local_60,this->mData + local_70);
    }
  }
  std::swap<int*>(&this->mData,(int **)local_60);
  std::swap<unsigned_long>(&this->mSize,&tmp.mCap);
  std::swap<unsigned_long>(&this->mCap,(unsigned_long *)&tmp);
  ~vector((vector<int> *)local_60);
  std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::~unordered_set
            ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
             &tmp.mSize);
  return;
}

Assistant:

void CP::vector<T>::uniq() {
  //do someting here
  std::unordered_set<T> s;
  CP::vector<T> tmp;
  for (int i = 0; i < mSize; ++i) {
    if (s.find(mData[i]) == s.end()) {
      s.insert(mData[i]);
      tmp.push_back(mData[i]);
    }
  }
  std::swap(mData, tmp.mData);
  std::swap(mSize, tmp.mSize);
  std::swap(mCap, tmp.mCap);
}